

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O3

void czh::utils::fill_exponent(int K,string *buffer)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)K;
  if (K < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,'-');
    uVar3 = (ulong)(uint)-K;
  }
  uVar2 = (uint)uVar3;
  if (uVar2 < 100) {
    if (uVar2 < 10) goto LAB_0010f95c;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (buffer,(char)(uVar3 / 100) + '0');
    uVar2 = uVar2 + (int)(uVar3 / 100) * -100;
  }
  bVar1 = (byte)((uVar2 & 0xff) / 10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (buffer,bVar1 | 0x30);
  uVar3 = (ulong)(byte)((char)uVar2 + bVar1 * -10);
LAB_0010f95c:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (buffer,(byte)uVar3 | 0x30);
  return;
}

Assistant:

void fill_exponent(int K, std::string &buffer)
  {
    if (K < 0)
    {
      buffer += '-';
      K = -K;
    }
  
    if (K >= 100)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 100);
      K %= 100;
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else if (K >= 10)
    {
      buffer += static_cast<char>(static_cast<int>('0') + K / 10);
      K %= 10;
      buffer += static_cast<char>(static_cast<int>('0') + K);
    }
    else
      buffer += static_cast<char>(static_cast<int>('0') + K);
  }